

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

short __thiscall MP1Node::getPortFromAddress(MP1Node *this,string *address)

{
  int iVar1;
  string local_48 [40];
  undefined8 uStack_20;
  short port;
  size_t pos;
  string *address_local;
  MP1Node *this_local;
  
  pos = (size_t)address;
  address_local = (string *)this;
  uStack_20 = std::__cxx11::string::find((char *)address,0x10e0b8);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_48,(ulong)address);
  iVar1 = std::__cxx11::stoi(local_48,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_48);
  return (short)iVar1;
}

Assistant:

short MP1Node::getPortFromAddress(string address) {
    size_t pos = address.find(":");
    short port = (short)stoi(address.substr(pos + 1, address.size()-pos-1));
    return port;
}